

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     DefaultPrintTo<std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>
               (long *param_1,ostream *param_2)

{
  long lVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *value;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_33,1);
  value = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
           *)*param_1;
  if (value != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)param_1[1]) {
    lVar1 = 0;
    do {
      if ((lVar1 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_35,1), lVar1 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(param_2," ...",4);
        goto LAB_0012f57a;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_34,1);
      PrintTo<std::__cxx11::string,unsigned_long>(value,param_2);
      value = value + 1;
      lVar1 = lVar1 + 1;
    } while (value != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                       *)param_1[1]);
    if (lVar1 != 0) {
LAB_0012f57a:
      std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_2,&local_31,1);
  return;
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}